

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

int AF_AActor_ResolveState
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int pos;
  bool bVar1;
  PClassActor *cls;
  FState *val;
  char *pcVar2;
  DObject *pDVar3;
  int iVar4;
  
  if (0 < numparam) {
    if ((param->field_0).field_3.Type != '\x03') {
LAB_004544df:
      pcVar2 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_004544f8;
    }
    pDVar3 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pDVar3 != (DObject *)0x0) {
        bVar1 = DObject::IsKindOf(pDVar3,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar2 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004544f8;
        }
      }
    }
    else if (pDVar3 != (DObject *)0x0) goto LAB_004544df;
    if (numparam == 1) goto LAB_004544e8;
    if (param[1].field_0.field_3.Type != '\x03') goto LAB_004544df;
    pDVar3 = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (pDVar3 == (DObject *)0x0) goto LAB_00454471;
      bVar1 = DObject::IsKindOf(pDVar3,AActor::RegistrationInfo.MyClass);
      if (!bVar1) {
        pcVar2 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_004544f8;
      }
    }
    else {
      if (pDVar3 != (DObject *)0x0) goto LAB_004544df;
LAB_00454471:
      pDVar3 = (DObject *)0x0;
    }
    if (2 < (uint)numparam) {
      if (param[2].field_0.field_3.Type == '\x03') {
        if (numparam == 3) {
          pcVar2 = "(paramnum) < numparam";
        }
        else {
          if (param[3].field_0.field_3.Type == '\0') {
            pos = param[3].field_0.i;
            cls = (PClassActor *)DObject::GetClass(pDVar3);
            iVar4 = 0;
            val = FStateLabelStorage::GetState(&StateLabels,pos,cls,false);
            if (0 < numret) {
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                              ,0x15e,
                              "int AF_AActor_ResolveState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              VMReturn::SetPointer(ret,val,0);
              iVar4 = 1;
            }
            return iVar4;
          }
          pcVar2 = "param[paramnum].Type == REGT_INT";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                      ,0x15d,
                      "int AF_AActor_ResolveState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pcVar2 = "param[paramnum].Type == REGT_POINTER";
      goto LAB_004544f8;
    }
  }
LAB_004544e8:
  pcVar2 = "(paramnum) < numparam";
LAB_004544f8:
  __assert_fail(pcVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_states.cpp"
                ,0x15c,
                "int AF_AActor_ResolveState(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, ResolveState)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_STATE_ACTION(newstate);
	ACTION_RETURN_STATE(newstate);
}